

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-dump.c
# Opt level: O0

char * fy_token_list_dump_format(fy_token_list *fytl,fy_token *fyt_highlight,char *buf,size_t bufsz)

{
  int iVar1;
  fy_token *pfVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  fy_token *local_40;
  fy_token *fyt;
  char *e;
  char *s;
  size_t bufsz_local;
  char *buf_local;
  fy_token *fyt_highlight_local;
  fy_token_list *fytl_local;
  
  local_40 = fy_token_list_first(fytl);
  e = buf;
  for (; local_40 != (fy_token *)0x0; local_40 = fy_token_next(fytl,local_40)) {
    pfVar2 = fy_token_list_first(fytl);
    pcVar4 = "";
    if (local_40 != pfVar2) {
      pcVar4 = ",";
    }
    pcVar5 = "";
    if (fyt_highlight == local_40) {
      pcVar5 = "*";
    }
    iVar1 = snprintf(e,(size_t)(buf + ((bufsz - 1) - (long)e)),"%s%s",pcVar4,pcVar5);
    pcVar4 = e + iVar1;
    fy_token_dump_format(local_40,pcVar4,(size_t)(buf + ((bufsz - 1) - (long)pcVar4)));
    sVar3 = strlen(pcVar4);
    e = pcVar4 + sVar3;
  }
  *e = '\0';
  return buf;
}

Assistant:

char *fy_token_list_dump_format(struct fy_token_list *fytl,
                                struct fy_token *fyt_highlight, char *buf, size_t bufsz) {
    char *s, *e;
    struct fy_token *fyt;

    s = buf;
    e = buf + bufsz - 1;
    for (fyt = fy_token_list_first(fytl); fyt; fyt = fy_token_next(fytl, fyt)) {

        s += snprintf(s, e - s, "%s%s",
                      fyt != fy_token_list_first(fytl) ? "," : "",
                      fyt_highlight == fyt ? "*" : "");

        fy_token_dump_format(fyt, s, e - s);

        s += strlen(s);
    }
    *s = '\0';

    return buf;
}